

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::BackgroundMark(Recycler *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  size_t sVar10;
  undefined8 *in_FS_OFFSET;
  
  bVar9 = DoQueueTrackedObject(this);
  if (!bVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1558,"(this->DoQueueTrackedObject())","this->DoQueueTrackedObject()");
    if (!bVar9) goto LAB_00271ec2;
    *puVar1 = 0;
  }
  this->backgroundRescanCount = '\0';
  DoBackgroundParallelMark(this);
  if ((this->needOOMRescan == false) && (this->isAborting == false)) {
    sVar10 = (this->collectionStats).markData.rescanPageCount;
    sVar3 = (this->collectionStats).markData.rescanObjectCount;
    sVar4 = (this->collectionStats).markData.rescanObjectByteCount;
    sVar5 = (this->collectionStats).markData.rescanLargePageCount;
    sVar6 = (this->collectionStats).markData.rescanLargeObjectCount;
    sVar7 = (this->collectionStats).markData.rescanLargeByteCount;
    sVar8 = (this->collectionStats).markData.markBytes;
    (this->collectionStats).backgroundMarkData[0].markCount =
         (this->collectionStats).markData.markCount;
    (this->collectionStats).backgroundMarkData[0].markBytes = sVar8;
    (this->collectionStats).backgroundMarkData[0].rescanLargeObjectCount = sVar6;
    (this->collectionStats).backgroundMarkData[0].rescanLargeByteCount = sVar7;
    (this->collectionStats).backgroundMarkData[0].rescanObjectByteCount = sVar4;
    (this->collectionStats).backgroundMarkData[0].rescanLargePageCount = sVar5;
    (this->collectionStats).backgroundMarkData[0].rescanPageCount = sVar10;
    (this->collectionStats).backgroundMarkData[0].rescanObjectCount = sVar3;
    bVar9 = Js::Phases::IsEnabled
                      ((Phases *)(Js::Configuration::Global + 0x11bc8),BackgroundRepeatMarkPhase);
    if (!bVar9) {
      sVar10 = BackgroundRepeatMark(this);
      if ((this->needOOMRescan == false) && (this->isAborting == false)) {
        if (sVar10 == 0xffffffffffffffff) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar1 = (undefined4 *)*in_FS_OFFSET;
          *puVar1 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x1574,"(rescannedPageCount != Recycler::InvalidScanRootBytes)",
                             "rescannedPageCount != Recycler::InvalidScanRootBytes");
          if (!bVar9) {
LAB_00271ec2:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar1 = 0;
        }
        if (0x7f < sVar10) {
          BackgroundRepeatMark(this);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void
Recycler::BackgroundMark()
{
    Assert(this->DoQueueTrackedObject());
    this->backgroundRescanCount = 0;

    this->DoBackgroundParallelMark();

    if (this->NeedOOMRescan() || this->isAborting)
    {
        return;
    }

#ifdef RECYCLER_STATS
    this->collectionStats.backgroundMarkData[0] = this->collectionStats.markData;
#endif

    if (PHASE_OFF1(Js::BackgroundRepeatMarkPhase))
    {
        return;
    }

    // We always do one repeat mark pass.
    size_t rescannedPageCount = this->BackgroundRepeatMark();

    if (this->NeedOOMRescan() || this->isAborting)
    {
        // OOM'ed. Let's not continue
        return;
    }

    Assert(rescannedPageCount != Recycler::InvalidScanRootBytes);

    // If we rescanned enough pages in the previous repeat mark pass, then do one more
    // to try to reduce the amount of work we need to do in-thread
    if (rescannedPageCount >= RecyclerHeuristic::BackgroundSecondRepeatMarkThreshold)
    {
        this->BackgroundRepeatMark();

        if (this->NeedOOMRescan() || this->isAborting)
        {
            // OOM'ed. Let's not continue
            return;
        }
    }
}